

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IndexFinder.cpp
# Opt level: O3

int __thiscall OpenMD::IndexFinder::init(IndexFinder *this,EVP_PKEY_CTX *ctx)

{
  ulong *puVar1;
  int iVar2;
  pointer ppAVar3;
  long lVar4;
  pointer ppRVar5;
  pointer ppBVar6;
  pointer ppBVar7;
  pointer ppTVar8;
  pointer ppIVar9;
  Molecule *pMVar10;
  ulong uVar11;
  int iVar12;
  Atom *pAVar13;
  RigidBody *pRVar14;
  Bond *pBVar15;
  Bend *pBVar16;
  Torsion *pTVar17;
  Inversion *pIVar18;
  pointer ppAVar19;
  pointer ppRVar20;
  pointer ppBVar21;
  pointer ppBVar22;
  pointer ppTVar23;
  pointer ppIVar24;
  MoleculeIterator mi;
  SelectionSet ss;
  MoleculeIterator local_68;
  vector<int,_std::allocator<int>_> local_60;
  SelectionSet local_48;
  
  local_68._M_node = (_Base_ptr)0x0;
  pMVar10 = SimInfo::beginMolecule(this->info_,&local_68);
  if (pMVar10 != (Molecule *)0x0) {
    do {
      std::vector<int,_std::allocator<int>_>::vector(&local_60,&this->nObjects_);
      SelectionSet::SelectionSet(&local_48,&local_60);
      if (local_60.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_start != (pointer)0x0) {
        operator_delete(local_60.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_60.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage -
                        (long)local_60.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_start);
      }
      iVar2 = pMVar10->globalIndex_;
      uVar11 = (ulong)iVar2;
      iVar12 = iVar2 + 0x3f;
      if (-1 < (long)uVar11) {
        iVar12 = iVar2;
      }
      puVar1 = (ulong *)((long)(iVar12 >> 6) * 8 +
                         (long)local_48.bitsets_.
                               super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>
                               ._M_impl.super__Vector_impl_data._M_start[5].bitset_.
                               super__Bvector_base<std::allocator<bool>_>._M_impl.
                               super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p + -8
                        + (ulong)((uVar11 & 0x800000000000003f) < 0x8000000000000001) * 8);
      *puVar1 = *puVar1 | 1L << ((byte)iVar2 & 0x3f);
      ppAVar19 = (pMVar10->atoms_).
                 super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>._M_impl.
                 super__Vector_impl_data._M_start;
      ppAVar3 = (pMVar10->atoms_).
                super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>._M_impl.
                super__Vector_impl_data._M_finish;
      if ((ppAVar19 != ppAVar3) && (pAVar13 = *ppAVar19, pAVar13 != (Atom *)0x0)) {
        lVar4 = (long)((local_48.bitsets_.
                        super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>
                        ._M_impl.super__Vector_impl_data._M_start)->bitset_).
                      super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
                      _M_start.super__Bit_iterator_base._M_p;
        do {
          ppAVar19 = ppAVar19 + 1;
          iVar2 = (pAVar13->super_StuntDouble).globalIndex_;
          iVar12 = iVar2 + 0x3f;
          if (-1 < (long)iVar2) {
            iVar12 = iVar2;
          }
          puVar1 = (ulong *)(lVar4 + (long)(iVar12 >> 6) * 8 + -8 +
                            (ulong)(((long)iVar2 & 0x800000000000003fU) < 0x8000000000000001) * 8);
          *puVar1 = *puVar1 | 1L << ((byte)iVar2 & 0x3f);
        } while ((ppAVar19 != ppAVar3) && (pAVar13 = *ppAVar19, pAVar13 != (Atom *)0x0));
      }
      ppRVar20 = (pMVar10->rigidBodies_).
                 super__Vector_base<OpenMD::RigidBody_*,_std::allocator<OpenMD::RigidBody_*>_>.
                 _M_impl.super__Vector_impl_data._M_start;
      ppRVar5 = (pMVar10->rigidBodies_).
                super__Vector_base<OpenMD::RigidBody_*,_std::allocator<OpenMD::RigidBody_*>_>.
                _M_impl.super__Vector_impl_data._M_finish;
      if ((ppRVar20 != ppRVar5) && (pRVar14 = *ppRVar20, pRVar14 != (RigidBody *)0x0)) {
        lVar4 = (long)((local_48.bitsets_.
                        super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>
                        ._M_impl.super__Vector_impl_data._M_start)->bitset_).
                      super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
                      _M_start.super__Bit_iterator_base._M_p;
        do {
          ppRVar20 = ppRVar20 + 1;
          iVar2 = (pRVar14->super_StuntDouble).globalIndex_;
          iVar12 = iVar2 + 0x3f;
          if (-1 < (long)iVar2) {
            iVar12 = iVar2;
          }
          puVar1 = (ulong *)(lVar4 + (long)(iVar12 >> 6) * 8 + -8 +
                            (ulong)(((long)iVar2 & 0x800000000000003fU) < 0x8000000000000001) * 8);
          *puVar1 = *puVar1 | 1L << ((byte)iVar2 & 0x3f);
        } while ((ppRVar20 != ppRVar5) && (pRVar14 = *ppRVar20, pRVar14 != (RigidBody *)0x0));
      }
      ppBVar21 = (pMVar10->bonds_).
                 super__Vector_base<OpenMD::Bond_*,_std::allocator<OpenMD::Bond_*>_>._M_impl.
                 super__Vector_impl_data._M_start;
      ppBVar6 = (pMVar10->bonds_).
                super__Vector_base<OpenMD::Bond_*,_std::allocator<OpenMD::Bond_*>_>._M_impl.
                super__Vector_impl_data._M_finish;
      if ((ppBVar21 != ppBVar6) && (pBVar15 = *ppBVar21, pBVar15 != (Bond *)0x0)) {
        lVar4 = (long)local_48.bitsets_.
                      super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>
                      ._M_impl.super__Vector_impl_data._M_start[1].bitset_.
                      super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
                      _M_start.super__Bit_iterator_base._M_p;
        do {
          ppBVar21 = ppBVar21 + 1;
          iVar2 = (pBVar15->super_ShortRangeInteraction).globalIndex_;
          iVar12 = iVar2 + 0x3f;
          if (-1 < (long)iVar2) {
            iVar12 = iVar2;
          }
          puVar1 = (ulong *)(lVar4 + (long)(iVar12 >> 6) * 8 + -8 +
                            (ulong)(((long)iVar2 & 0x800000000000003fU) < 0x8000000000000001) * 8);
          *puVar1 = *puVar1 | 1L << ((byte)iVar2 & 0x3f);
        } while ((ppBVar21 != ppBVar6) && (pBVar15 = *ppBVar21, pBVar15 != (Bond *)0x0));
      }
      ppBVar22 = (pMVar10->bends_).
                 super__Vector_base<OpenMD::Bend_*,_std::allocator<OpenMD::Bend_*>_>._M_impl.
                 super__Vector_impl_data._M_start;
      ppBVar7 = (pMVar10->bends_).
                super__Vector_base<OpenMD::Bend_*,_std::allocator<OpenMD::Bend_*>_>._M_impl.
                super__Vector_impl_data._M_finish;
      if ((ppBVar22 != ppBVar7) && (pBVar16 = *ppBVar22, pBVar16 != (Bend *)0x0)) {
        lVar4 = (long)local_48.bitsets_.
                      super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>
                      ._M_impl.super__Vector_impl_data._M_start[2].bitset_.
                      super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
                      _M_start.super__Bit_iterator_base._M_p;
        do {
          ppBVar22 = ppBVar22 + 1;
          iVar2 = (pBVar16->super_ShortRangeInteraction).globalIndex_;
          iVar12 = iVar2 + 0x3f;
          if (-1 < (long)iVar2) {
            iVar12 = iVar2;
          }
          puVar1 = (ulong *)(lVar4 + (long)(iVar12 >> 6) * 8 + -8 +
                            (ulong)(((long)iVar2 & 0x800000000000003fU) < 0x8000000000000001) * 8);
          *puVar1 = *puVar1 | 1L << ((byte)iVar2 & 0x3f);
        } while ((ppBVar22 != ppBVar7) && (pBVar16 = *ppBVar22, pBVar16 != (Bend *)0x0));
      }
      ppTVar23 = (pMVar10->torsions_).
                 super__Vector_base<OpenMD::Torsion_*,_std::allocator<OpenMD::Torsion_*>_>._M_impl.
                 super__Vector_impl_data._M_start;
      ppTVar8 = (pMVar10->torsions_).
                super__Vector_base<OpenMD::Torsion_*,_std::allocator<OpenMD::Torsion_*>_>._M_impl.
                super__Vector_impl_data._M_finish;
      if ((ppTVar23 != ppTVar8) && (pTVar17 = *ppTVar23, pTVar17 != (Torsion *)0x0)) {
        lVar4 = (long)local_48.bitsets_.
                      super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>
                      ._M_impl.super__Vector_impl_data._M_start[3].bitset_.
                      super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
                      _M_start.super__Bit_iterator_base._M_p;
        do {
          ppTVar23 = ppTVar23 + 1;
          iVar2 = (pTVar17->super_ShortRangeInteraction).globalIndex_;
          iVar12 = iVar2 + 0x3f;
          if (-1 < (long)iVar2) {
            iVar12 = iVar2;
          }
          puVar1 = (ulong *)(lVar4 + (long)(iVar12 >> 6) * 8 + -8 +
                            (ulong)(((long)iVar2 & 0x800000000000003fU) < 0x8000000000000001) * 8);
          *puVar1 = *puVar1 | 1L << ((byte)iVar2 & 0x3f);
        } while ((ppTVar23 != ppTVar8) && (pTVar17 = *ppTVar23, pTVar17 != (Torsion *)0x0));
      }
      ppIVar24 = (pMVar10->inversions_).
                 super__Vector_base<OpenMD::Inversion_*,_std::allocator<OpenMD::Inversion_*>_>.
                 _M_impl.super__Vector_impl_data._M_start;
      ppIVar9 = (pMVar10->inversions_).
                super__Vector_base<OpenMD::Inversion_*,_std::allocator<OpenMD::Inversion_*>_>.
                _M_impl.super__Vector_impl_data._M_finish;
      if ((ppIVar24 != ppIVar9) && (pIVar18 = *ppIVar24, pIVar18 != (Inversion *)0x0)) {
        lVar4 = (long)local_48.bitsets_.
                      super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>
                      ._M_impl.super__Vector_impl_data._M_start[4].bitset_.
                      super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
                      _M_start.super__Bit_iterator_base._M_p;
        do {
          ppIVar24 = ppIVar24 + 1;
          iVar2 = (pIVar18->super_ShortRangeInteraction).globalIndex_;
          iVar12 = iVar2 + 0x3f;
          if (-1 < (long)iVar2) {
            iVar12 = iVar2;
          }
          puVar1 = (ulong *)(lVar4 + (long)(iVar12 >> 6) * 8 + -8 +
                            (ulong)(((long)iVar2 & 0x800000000000003fU) < 0x8000000000000001) * 8);
          *puVar1 = *puVar1 | 1L << ((byte)iVar2 & 0x3f);
        } while ((ppIVar24 != ppIVar9) && (pIVar18 = *ppIVar24, pIVar18 != (Inversion *)0x0));
      }
      std::vector<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>::operator=
                (&(this->selectionSets_).
                  super__Vector_base<OpenMD::SelectionSet,_std::allocator<OpenMD::SelectionSet>_>.
                  _M_impl.super__Vector_impl_data._M_start[uVar11].bitsets_,&local_48.bitsets_);
      std::vector<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>::~vector
                (&local_48.bitsets_);
      pMVar10 = SimInfo::nextMolecule(this->info_,&local_68);
    } while (pMVar10 != (Molecule *)0x0);
  }
  return (int)pMVar10;
}

Assistant:

void IndexFinder::init() {
    SimInfo::MoleculeIterator mi;
    Molecule::AtomIterator ai;
    Molecule::RigidBodyIterator rbIter;
    Molecule::BondIterator bondIter;
    Molecule::BendIterator bendIter;
    Molecule::TorsionIterator torsionIter;
    Molecule::InversionIterator inversionIter;

    Molecule* mol;
    Atom* atom;
    RigidBody* rb;
    Bond* bond;
    Bend* bend;
    Torsion* torsion;
    Inversion* inversion;

    for (mol = info_->beginMolecule(mi); mol != NULL;
         mol = info_->nextMolecule(mi)) {
      SelectionSet ss(nObjects_);

      ss.bitsets_[MOLECULE].setBitOn(mol->getGlobalIndex());

      for (atom = mol->beginAtom(ai); atom != NULL; atom = mol->nextAtom(ai)) {
        ss.bitsets_[STUNTDOUBLE].setBitOn(atom->getGlobalIndex());
      }
      for (rb = mol->beginRigidBody(rbIter); rb != NULL;
           rb = mol->nextRigidBody(rbIter)) {
        ss.bitsets_[STUNTDOUBLE].setBitOn(rb->getGlobalIndex());
      }
      for (bond = mol->beginBond(bondIter); bond != NULL;
           bond = mol->nextBond(bondIter)) {
        ss.bitsets_[BOND].setBitOn(bond->getGlobalIndex());
      }
      for (bend = mol->beginBend(bendIter); bend != NULL;
           bend = mol->nextBend(bendIter)) {
        ss.bitsets_[BEND].setBitOn(bend->getGlobalIndex());
      }
      for (torsion = mol->beginTorsion(torsionIter); torsion != NULL;
           torsion = mol->nextTorsion(torsionIter)) {
        ss.bitsets_[TORSION].setBitOn(torsion->getGlobalIndex());
      }
      for (inversion = mol->beginInversion(inversionIter); inversion != NULL;
           inversion = mol->nextInversion(inversionIter)) {
        ss.bitsets_[INVERSION].setBitOn(inversion->getGlobalIndex());
      }

      selectionSets_[mol->getGlobalIndex()] = ss;
    }
  }